

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

QDebug operator<<(QDebug *d,QMetaType m)

{
  QDebug *pQVar1;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebugStateSaver *in_stack_ffffffffffffff80;
  QDebug *in_stack_ffffffffffffff98;
  QDebugStateSaver *in_stack_ffffffffffffffa0;
  Stream *this;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pQVar1 = in_RSI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)this,(char *)pQVar1);
  QMetaType::name(&local_10);
  QDebug::operator<<((QDebug *)this,(char *)pQVar1);
  pQVar1 = QDebug::operator<<((QDebug *)this,(char *)pQVar1);
  QDebug::QDebug((QDebug *)this,pQVar1);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug d, QMetaType m)
{
    const QDebugStateSaver saver(d);
    return d.nospace() << "QMetaType(" << m.name() << ")";
}